

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,bool ignore_top)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  undefined1 local_a8 [8];
  string gen_name;
  string local_68;
  string local_48 [32];
  
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  Generator::handle_name_abi_cxx11_
            ((string *)local_a8,(Generator *)CONCAT44(extraout_var,iVar1),ignore_top);
  if (gen_name._M_dataplus._M_p == (pointer)0x0) {
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(__return_storage_ptr__,this);
  }
  else {
    iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
    Generator::handle_name_abi_cxx11_
              (&local_68,(Generator *)CONCAT44(extraout_var_00,iVar1),ignore_top);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(local_48,this);
    gen_name.field_2._8_8_ = local_68._M_dataplus._M_p;
    bVar2 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
    format_str.data_ = (char *)bVar2.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&gen_name.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)bVar2.data_,format_str,args);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Var::handle_name(bool ignore_top) const {
    auto gen_name = generator()->handle_name(ignore_top);
    if (!gen_name.empty())
        return ::format("{0}.{1}", generator()->handle_name(ignore_top), to_string());
    else
        return to_string();
}